

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimulationIslandManager.cpp
# Opt level: O2

void __thiscall
cbtSimulationIslandManager::buildAndProcessIslands
          (cbtSimulationIslandManager *this,cbtDispatcher *dispatcher,
          cbtCollisionWorld *collisionWorld,IslandCallback *callback)

{
  cbtElement *pcVar1;
  cbtPersistentManifold **ppcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  cbtPersistentManifold **ppcVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  CProfileSample __profile;
  cbtCollisionObject *colObj0;
  ulong local_60;
  IslandCallback *local_58;
  ulong local_50;
  cbtAlignedObjectArray<cbtCollisionObject_*> *local_48;
  cbtCollisionWorld *local_40;
  long local_38;
  
  local_58 = callback;
  buildIslands(this,dispatcher,collisionWorld);
  iVar3 = (this->m_unionFind).m_elements.m_size;
  CProfileSample::CProfileSample((CProfileSample *)&__profile,"processIslands");
  if (this->m_splitIslands == false) {
    iVar3 = (*dispatcher->_vptr_cbtDispatcher[0xb])(dispatcher);
    iVar4 = (*dispatcher->_vptr_cbtDispatcher[9])(dispatcher);
    (**(code **)(*(long *)local_58 + 0x10))
              (local_58,(collisionWorld->m_collisionObjects).m_data,
               (collisionWorld->m_collisionObjects).m_size,iVar3,iVar4,0xffffffffffffffff);
  }
  else {
    iVar4 = (this->m_islandmanifold).m_size;
    local_40 = collisionWorld;
    if ((collisionWorld->m_dispatchInfo).m_deterministicOverlappingPairs == true) {
      cbtAlignedObjectArray<cbtPersistentManifold_*>::
      quickSort<cbtPersistentManifoldSortPredicateDeterministic>
                (&this->m_islandmanifold,(cbtPersistentManifoldSortPredicateDeterministic *)&colObj0
                );
    }
    else {
      cbtAlignedObjectArray<cbtPersistentManifold_*>::quickSort<cbtPersistentManifoldSortPredicate>
                (&this->m_islandmanifold,(cbtPersistentManifoldSortPredicate *)&colObj0);
    }
    local_38 = (long)iVar3;
    local_48 = &this->m_islandBodies;
    uVar12 = 1;
    uVar8 = 0;
    iVar7 = 0;
    local_50 = (long)iVar4;
    while (iVar7 < iVar3) {
      lVar10 = (long)iVar7;
      bVar13 = true;
      iVar4 = (this->m_unionFind).m_elements.m_data[lVar10].m_id;
      local_60 = uVar8;
      for (; (iVar5 = iVar3, local_38 != lVar10 &&
             (pcVar1 = (this->m_unionFind).m_elements.m_data, iVar5 = iVar7,
             pcVar1[lVar10].m_id == iVar4)); lVar10 = lVar10 + 1) {
        colObj0 = (local_40->m_collisionObjects).m_data[pcVar1[lVar10].m_sz];
        cbtAlignedObjectArray<cbtCollisionObject_*>::push_back(local_48,&colObj0);
        iVar7 = iVar7 + 1;
        bVar13 = (bool)(bVar13 & (colObj0->m_activationState1 == 5 ||
                                 colObj0->m_activationState1 == 2));
      }
      iVar7 = iVar5;
      iVar5 = (int)local_60;
      if (iVar5 < (int)local_50) {
        ppcVar2 = (this->m_islandmanifold).m_data;
        lVar10 = (long)iVar5;
        iVar9 = ppcVar2[lVar10]->m_body0->m_islandTag1;
        if (iVar9 < 0) {
          iVar9 = ppcVar2[lVar10]->m_body1->m_islandTag1;
        }
        if (iVar9 != iVar4) goto LAB_00dea6c0;
        ppcVar6 = ppcVar2 + lVar10;
        uVar11 = local_60 & 0xffffffff;
        uVar8 = (ulong)(iVar5 + 1U);
        if ((int)(iVar5 + 1U) < (int)local_50) {
          uVar8 = local_50 & 0xffffffff;
        }
        do {
          lVar10 = lVar10 + 1;
          uVar12 = uVar8;
          if ((long)local_50 <= lVar10) break;
          iVar9 = ppcVar2[lVar10]->m_body0->m_islandTag1;
          if (iVar9 < 0) {
            iVar9 = ppcVar2[lVar10]->m_body1->m_islandTag1;
          }
          uVar11 = (ulong)((int)uVar11 + 1);
          uVar12 = uVar11;
        } while (iVar4 == iVar9);
        iVar5 = (int)uVar12 - iVar5;
      }
      else {
LAB_00dea6c0:
        iVar5 = 0;
        ppcVar6 = (cbtPersistentManifold **)0x0;
      }
      if (!bVar13) {
        (**(code **)(*(long *)local_58 + 0x10))
                  (local_58,(this->m_islandBodies).m_data,(this->m_islandBodies).m_size,ppcVar6,
                   iVar5,iVar4);
      }
      colObj0 = (cbtCollisionObject *)0x0;
      cbtAlignedObjectArray<cbtCollisionObject_*>::resize(local_48,0,&colObj0);
      uVar8 = local_60;
      if (iVar5 != 0) {
        uVar8 = uVar12;
      }
      uVar8 = uVar8 & 0xffffffff;
    }
  }
  CProfileSample::~CProfileSample((CProfileSample *)&__profile);
  return;
}

Assistant:

void cbtSimulationIslandManager::buildAndProcessIslands(cbtDispatcher* dispatcher, cbtCollisionWorld* collisionWorld, IslandCallback* callback)
{
	cbtCollisionObjectArray& collisionObjects = collisionWorld->getCollisionObjectArray();

	buildIslands(dispatcher, collisionWorld);

	int endIslandIndex = 1;
	int startIslandIndex;
	int numElem = getUnionFind().getNumElements();

	BT_PROFILE("processIslands");

	if (!m_splitIslands)
	{
		cbtPersistentManifold** manifold = dispatcher->getInternalManifoldPointer();
		int maxNumManifolds = dispatcher->getNumManifolds();
		callback->processIsland(&collisionObjects[0], collisionObjects.size(), manifold, maxNumManifolds, -1);
	}
	else
	{
		// Sort manifolds, based on islands
		// Sort the vector using predicate and std::sort
		//std::sort(islandmanifold.begin(), islandmanifold.end(), cbtPersistentManifoldSortPredicate);

		int numManifolds = int(m_islandmanifold.size());

		//tried a radix sort, but quicksort/heapsort seems still faster
		//@todo rewrite island management
		//cbtPersistentManifoldSortPredicateDeterministic sorts contact manifolds based on islandid,
		//but also based on object0 unique id and object1 unique id
		if (collisionWorld->getDispatchInfo().m_deterministicOverlappingPairs)
		{
			m_islandmanifold.quickSort(cbtPersistentManifoldSortPredicateDeterministic());
		}
		else
		{
			m_islandmanifold.quickSort(cbtPersistentManifoldSortPredicate());
		}

		//m_islandmanifold.heapSort(cbtPersistentManifoldSortPredicate());

		//now process all active islands (sets of manifolds for now)

		int startManifoldIndex = 0;
		int endManifoldIndex = 1;

		//int islandId;

		//	printf("Start Islands\n");

		//traverse the simulation islands, and call the solver, unless all objects are sleeping/deactivated
		for (startIslandIndex = 0; startIslandIndex < numElem; startIslandIndex = endIslandIndex)
		{
			int islandId = getUnionFind().getElement(startIslandIndex).m_id;

			bool islandSleeping = true;

			for (endIslandIndex = startIslandIndex; (endIslandIndex < numElem) && (getUnionFind().getElement(endIslandIndex).m_id == islandId); endIslandIndex++)
			{
				int i = getUnionFind().getElement(endIslandIndex).m_sz;
				cbtCollisionObject* colObj0 = collisionObjects[i];
				m_islandBodies.push_back(colObj0);
				if (colObj0->isActive())
					islandSleeping = false;
			}

			//find the accompanying contact manifold for this islandId
			int numIslandManifolds = 0;
			cbtPersistentManifold** startManifold = 0;

			if (startManifoldIndex < numManifolds)
			{
				int curIslandId = getIslandId(m_islandmanifold[startManifoldIndex]);
				if (curIslandId == islandId)
				{
					startManifold = &m_islandmanifold[startManifoldIndex];

					for (endManifoldIndex = startManifoldIndex + 1; (endManifoldIndex < numManifolds) && (islandId == getIslandId(m_islandmanifold[endManifoldIndex])); endManifoldIndex++)
					{
					}
					/// Process the actual simulation, only if not sleeping/deactivated
					numIslandManifolds = endManifoldIndex - startManifoldIndex;
				}
			}

			if (!islandSleeping)
			{
				callback->processIsland(&m_islandBodies[0], m_islandBodies.size(), startManifold, numIslandManifolds, islandId);
				//			printf("Island callback of size:%d bodies, %d manifolds\n",islandBodies.size(),numIslandManifolds);
			}

			if (numIslandManifolds)
			{
				startManifoldIndex = endManifoldIndex;
			}

			m_islandBodies.resize(0);
		}
	}  // else if(!splitIslands)
}